

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::applyScaling(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp)

{
  DataArray<int> *this_00;
  type_conflict5 tVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong *puVar5;
  int __c;
  int __c_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int j_1;
  int exp2_1;
  int exp1_1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec_1;
  int i_1;
  int j;
  int exp2;
  int exp1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  int i;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff8e8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8f0;
  DataArray<int> *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  uint uVar6;
  undefined4 in_stack_fffffffffffff904;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff930;
  undefined1 local_698 [56];
  ulong local_660;
  undefined1 local_654 [56];
  undefined1 local_61c [56];
  undefined1 local_5e4 [56];
  undefined1 local_5ac [56];
  undefined1 local_574 [56];
  undefined1 local_53c [56];
  undefined1 local_504 [56];
  undefined1 local_4cc [56];
  uint local_494;
  int local_490;
  int local_48c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_488;
  int local_47c;
  undefined1 local_478 [56];
  undefined1 local_440 [56];
  ulong local_408;
  undefined1 local_3fc [56];
  undefined1 local_3c4 [56];
  undefined1 local_38c [56];
  undefined1 local_354 [56];
  undefined1 local_31c [56];
  undefined1 local_2e4 [56];
  undefined1 local_2ac [56];
  undefined1 local_274 [56];
  uint local_23c;
  int local_238;
  int local_234;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_230;
  int local_224;
  DataArray<int> *local_220;
  DataArray<int> *local_218;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_210;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  ulong *local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  ulong *local_1b0;
  undefined1 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  ulong *local_20;
  undefined8 local_18;
  ulong *local_10;
  undefined8 local_8;
  
  local_218 = &(in_RSI->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).scaleExp;
  local_220 = &(in_RSI->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).scaleExp;
  local_210 = in_RSI;
  for (local_224 = 0; iVar3 = local_224,
      iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3afe39), iVar3 < iVar2; local_224 = local_224 + 1) {
    local_230 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rowVector_w(in_stack_fffffffffffff8f0,
                              (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    piVar4 = DataArray<int>::operator[](local_220,local_224);
    local_238 = *piVar4;
    for (local_23c = 0; uVar6 = local_23c,
        iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_230), this_00 = local_218, (int)uVar6 < iVar3;
        local_23c = local_23c + 1) {
      piVar4 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::index(local_230,(char *)(ulong)local_23c,__c);
      piVar4 = DataArray<int>::operator[](this_00,*piVar4);
      local_234 = *piVar4;
      local_1a0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_230,local_23c);
      local_198 = local_2ac;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
      local_a8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_230,local_23c);
      local_b0 = local_274;
      local_a0 = local_b0;
      local_28 = local_b0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
    }
    local_190 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::maxRowObj(in_stack_fffffffffffff8f0,
                            (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    local_188 = local_31c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8)
    ;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
    local_b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::maxRowObj_w(in_stack_fffffffffffff8f0,
                             (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    local_c0 = local_2e4;
    local_98 = local_c0;
    local_30 = local_c0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8)
    ;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::rhs(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    local_1f8 = infinity();
    local_1f0 = local_354;
    local_200 = 0;
    local_8 = local_1f8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (double)in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff8e8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b0101);
    if (tVar1) {
      local_180 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs_w(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20))
      ;
      local_178 = local_3c4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
      local_c8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs_w(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      local_d0 = local_38c;
      local_90 = local_d0;
      local_38 = local_d0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lhs(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    puVar5 = (ulong *)infinity();
    local_408 = *puVar5 ^ 0x8000000000000000;
    local_1d8 = local_3fc;
    local_1e0 = &local_408;
    local_1e8 = 0;
    local_10 = local_1e0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (double)in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff8e8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b0275);
    if (tVar1) {
      local_170 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs_w(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20))
      ;
      local_168 = local_478;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
      local_d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::lhs_w(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      local_e0 = local_440;
      local_88 = local_e0;
      local_40 = local_e0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
    }
    SPxOut::
    debug<soplex::SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[28],_int_&,_int_&,_0>
              (in_RDI,(char (*) [28])"DEBUG: rowscaleExp({}): {}\n",&local_224,&local_238);
  }
  local_47c = 0;
  while (iVar3 = local_47c,
        iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x3b0396), iVar3 < iVar2) {
    local_488 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector_w(in_stack_fffffffffffff8f0,
                              (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    piVar4 = DataArray<int>::operator[](local_218,local_47c);
    local_490 = *piVar4;
    local_494 = 0;
    while (uVar6 = local_494,
          iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_488), (int)uVar6 < iVar2) {
      in_stack_fffffffffffff8f8 = local_220;
      piVar4 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::index(local_488,(char *)(ulong)local_494,__c_00);
      piVar4 = DataArray<int>::operator[](in_stack_fffffffffffff8f8,*piVar4);
      local_48c = *piVar4;
      local_160 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_488,local_494);
      local_158 = local_504;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
      local_e8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_488,local_494);
      local_f0 = local_4cc;
      local_80 = local_f0;
      local_48 = local_f0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
      local_494 = local_494 + 1;
    }
    local_150 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::maxObj_w(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20)
                          );
    local_148 = local_574;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8)
    ;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
    local_f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::maxObj_w(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20))
    ;
    local_100 = local_53c;
    local_78 = local_100;
    local_50 = local_100;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8)
    ;
    in_stack_fffffffffffff8f0 =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::upper(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    local_1c8 = infinity();
    local_1c0 = local_5ac;
    local_1d0 = 0;
    local_18 = local_1c8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar3,uVar6),
               (double)in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff8e8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b065e);
    if (tVar1) {
      local_140 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper_w(in_stack_fffffffffffff8f0,
                            (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      local_138 = local_61c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
      local_108 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper_w(in_stack_fffffffffffff8f0,
                            (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      local_110 = local_5e4;
      local_70 = local_110;
      local_58 = local_110;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
    }
    in_stack_fffffffffffff8e8 =
         &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::lower(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20))->
          m_backend;
    puVar5 = (ulong *)infinity();
    local_660 = *puVar5 ^ 0x8000000000000000;
    local_1a8 = local_654;
    local_1b0 = &local_660;
    local_1b8 = 0;
    local_20 = local_1b0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar3,uVar6),
               (double)in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff8e8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b07d2);
    if (tVar1) {
      local_130 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower_w(in_stack_fffffffffffff8f0,
                            (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      local_128 = &stack0xfffffffffffff930;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff930,(int)((ulong)in_RDI >> 0x20));
      local_118 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower_w(in_stack_fffffffffffff8f0,
                            (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      local_120 = local_698;
      local_68 = local_120;
      local_60 = local_120;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8e8);
    }
    SPxOut::
    debug<soplex::SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[28],_int_&,_int_&,_0>
              (in_RDI,(char (*) [28])"DEBUG: colscaleExp({}): {}\n",&local_47c,&local_490);
    local_47c = local_47c + 1;
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setScalingInfo(local_210,true);
  return;
}

Assistant:

void SPxScaler<R>::applyScaling(SPxLPBase<R>& lp)
{
   assert(lp.nCols() == m_activeColscaleExp->size());
   assert(lp.nRows() == m_activeRowscaleExp->size());

   DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);
      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), exp2);

      SPxOut::debug(this, "DEBUG: rowscaleExp({}): {}\n", i, exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);
      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), -exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), -exp2);

      SPxOut::debug(this, "DEBUG: colscaleExp({}): {}\n", i, exp2);
   }

   lp.setScalingInfo(true);
   assert(lp.isConsistent());
}